

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O2

void __thiscall wasm::MultiMemoryLowering::run(MultiMemoryLowering *this,Module *module)

{
  byte *pbVar1;
  Replacer local_158;
  
  pbVar1 = (byte *)((long)&(module->features).features + 1);
  *pbVar1 = *pbVar1 & 0x7f;
  if (8 < (ulong)((long)(module->memories).
                        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(module->memories).
                       super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
    this->wasm = module;
    prepCombinedMemory(this);
    makeOffsetGlobals(this);
    adjustActiveDataSegmentOffsets(this);
    createMemorySizeFunctions(this);
    createMemoryGrowFunctions(this);
    removeExistingMemories(this);
    addCombinedMemory(this);
    if (this->isExported == true) {
      updateMemoryExports(this);
    }
    Replacer::Replacer(&local_158,this,this->wasm);
    WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
    ::run(&local_158.
           super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
          ,(this->super_Pass).runner,this->wasm);
    WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
    ::~WalkerPass(&local_158.
                   super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
                 );
  }
  return;
}

Assistant:

void run(Module* module) override {
    module->features.disable(FeatureSet::MultiMemory);

    // If there are no memories or 1 memory, skip this pass
    if (module->memories.size() <= 1) {
      return;
    }

    this->wasm = module;

    prepCombinedMemory();
    makeOffsetGlobals();
    adjustActiveDataSegmentOffsets();
    createMemorySizeFunctions();
    createMemoryGrowFunctions();
    removeExistingMemories();
    addCombinedMemory();
    if (isExported) {
      updateMemoryExports();
    }

    Replacer(*this, *wasm).run(getPassRunner(), wasm);
  }